

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

void * a0ialloc(size_t size,_Bool zero,_Bool is_internal)

{
  long *plVar1;
  void *pvVar2;
  _Bool _Var3;
  szind_t ind;
  arena_t *arena;
  rtree_ctx_t *rtree_ctx;
  uintptr_t key;
  ulong key_00;
  rtree_metadata_t rVar4;
  rtree_contents_t local_1c0;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (duckdb_je_malloc_init_state == malloc_init_uninitialized) {
    malloc_mutex_lock((tsdn_t *)0x0,&init_lock);
    _Var3 = malloc_init_hard_a0_locked();
    init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x48));
    if (_Var3) {
      return (void *)0x0;
    }
  }
  if (size < 0x1001) {
    ind = (szind_t)duckdb_je_sz_size2index_tab[size + 7 >> 3];
  }
  else {
    ind = sz_size2index_compute(size);
  }
  arena = arena_get((tsdn_t *)0x0,0,true);
  key_00 = (ulong)zero;
  rtree_ctx = (rtree_ctx_t *)
              duckdb_je_arena_malloc_hard((tsdn_t *)0x0,arena,size,ind,zero,size < 0x3801);
  if ((is_internal) && (rtree_ctx != (rtree_ctx_t *)0x0)) {
    duckdb_je_rtree_ctx_data_init(&rtree_ctx_fallback);
    rtree_read(&local_1c0,(tsdn_t *)0x0,(rtree_t *)&rtree_ctx_fallback,rtree_ctx,key_00);
    key = (uintptr_t)((uint)(local_1c0.edata)->e_bits & 0xfff);
    pvVar2 = duckdb_je_arenas[key].repr;
    duckdb_je_rtree_ctx_data_init(&rtree_ctx_fallback);
    rVar4 = rtree_metadata_read((tsdn_t *)0x0,(rtree_t *)&rtree_ctx_fallback,rtree_ctx,key);
    LOCK();
    plVar1 = (long *)((long)pvVar2 + 0x48);
    *plVar1 = *plVar1 + duckdb_je_sz_index2size_tab[rVar4.szind];
    UNLOCK();
  }
  return rtree_ctx;
}

Assistant:

static void *
a0ialloc(size_t size, bool zero, bool is_internal) {
	if (unlikely(malloc_init_a0())) {
		return NULL;
	}

	return iallocztm(TSDN_NULL, size, sz_size2index(size), zero, NULL,
	    is_internal, arena_get(TSDN_NULL, 0, true), true);
}